

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoiseEditDelete(linenoiseState *l)

{
  int iVar1;
  int chlen;
  linenoiseState *l_local;
  
  if ((l->len != 0) && (l->pos < l->len)) {
    iVar1 = (*(code *)nextCharLen)(l->buf,l->len,l->pos,0);
    memmove(l->buf + l->pos,l->buf + (long)iVar1 + l->pos,(l->len - l->pos) - (long)iVar1);
    l->len = l->len - (long)iVar1;
    l->buf[l->len] = '\0';
    refreshLine(l);
  }
  return;
}

Assistant:

void linenoiseEditDelete(struct linenoiseState *l) {
    if (l->len > 0 && l->pos < l->len) {
        int chlen = nextCharLen(l->buf,l->len,l->pos,NULL);
        memmove(l->buf+l->pos,l->buf+l->pos+chlen,l->len-l->pos-chlen);
        l->len-=chlen;
        l->buf[l->len] = '\0';
        refreshLine(l);
    }
}